

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void __thiscall TestCase::TestPassed(TestCase *this)

{
  TestCase *this_local;
  
  Mutex::Lock();
  if ((this->mTestComplete & 1U) == 0) {
    this->mTestComplete = true;
    this->mTestPassed = true;
  }
  else {
    if ((this->mTestPassed & 1U) != 0) {
      printf(" BAD TEST CASE, TestPassed called twice\n");
    }
    this->mTestPassed = false;
  }
  Mutex::Unlock();
  return;
}

Assistant:

void TestPassed()
	{
		mMutex.Lock();
		
		if ( mTestComplete )
		{
			if ( mTestPassed )
				printf( " BAD TEST CASE, TestPassed called twice\n" );

			mTestPassed = false;
		}
		else
		{
			mTestComplete = true;
			mTestPassed = true;
		}
		mMutex.Unlock();
	}